

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O0

void __thiscall
cfgfile::details::parser_conffile_impl_t<cfgfile::qstring_trait_t>::start_tag_parsing
          (parser_conffile_impl_t<cfgfile::qstring_trait_t> *this,
          tag_t<cfgfile::qstring_trait_t> *parent,child_tags_list_t *list)

{
  bool bVar1;
  reference pptVar2;
  undefined8 uVar3;
  input_stream_t<cfgfile::qstring_trait_t> *this_00;
  undefined8 in_RDX;
  tag_t<cfgfile::qstring_trait_t> *in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  tag_t<cfgfile::qstring_trait_t> *in_stack_000001b8;
  lexeme_t<cfgfile::qstring_trait_t> *in_stack_000001c0;
  parser_conffile_impl_t<cfgfile::qstring_trait_t> *in_stack_000001c8;
  tag_t<cfgfile::qstring_trait_t> *tag;
  const_iterator __end0;
  const_iterator __begin0;
  child_tags_list_t *__range3;
  bool tag_found;
  lexeme_t<cfgfile::qstring_trait_t> lexeme;
  lexical_analyzer_t<cfgfile::qstring_trait_t> *in_stack_000003b8;
  vector<cfgfile::tag_t<cfgfile::qstring_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::qstring_trait_t>_*>_>
  *in_stack_fffffffffffffd28;
  __normal_iterator<cfgfile::tag_t<cfgfile::qstring_trait_t>_*const_*,_std::vector<cfgfile::tag_t<cfgfile::qstring_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::qstring_trait_t>_*>_>_>
  *in_stack_fffffffffffffd30;
  string_t *what;
  exception_t<cfgfile::qstring_trait_t> *this_01;
  allocator<char> *__a;
  undefined7 in_stack_fffffffffffffd68;
  undefined1 in_stack_fffffffffffffd6f;
  string_t local_229 [2];
  exception_t<cfgfile::qstring_trait_t> local_1e9 [3];
  allocator<char> local_169 [265];
  tag_t<cfgfile::qstring_trait_t> *local_60;
  tag_t<cfgfile::qstring_trait_t> **local_58;
  __normal_iterator<cfgfile::tag_t<cfgfile::qstring_trait_t>_*const_*,_std::vector<cfgfile::tag_t<cfgfile::qstring_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::qstring_trait_t>_*>_>_>
  local_50;
  undefined8 local_48;
  byte local_39;
  lexeme_t<cfgfile::qstring_trait_t> local_38;
  undefined8 local_18;
  tag_t<cfgfile::qstring_trait_t> *local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  lexical_analyzer_t<cfgfile::qstring_trait_t>::next_lexeme(in_stack_000003b8);
  local_39 = 0;
  local_48 = local_18;
  local_50._M_current =
       (tag_t<cfgfile::qstring_trait_t> **)
       std::
       vector<cfgfile::tag_t<cfgfile::qstring_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::qstring_trait_t>_*>_>
       ::begin(in_stack_fffffffffffffd28);
  local_58 = (tag_t<cfgfile::qstring_trait_t> **)
             std::
             vector<cfgfile::tag_t<cfgfile::qstring_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::qstring_trait_t>_*>_>
             ::end(in_stack_fffffffffffffd28);
  do {
    bVar1 = __gnu_cxx::operator!=
                      (in_stack_fffffffffffffd30,
                       (__normal_iterator<cfgfile::tag_t<cfgfile::qstring_trait_t>_*const_*,_std::vector<cfgfile::tag_t<cfgfile::qstring_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::qstring_trait_t>_*>_>_>
                        *)in_stack_fffffffffffffd28);
    if (!bVar1) {
LAB_00137643:
      if ((local_39 & 1) != 0) {
        lexeme_t<cfgfile::qstring_trait_t>::~lexeme_t
                  ((lexeme_t<cfgfile::qstring_trait_t> *)0x137c60);
        return;
      }
      uVar3 = __cxa_allocate_exception(0x28);
      __a = local_169;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_RDI,(char *)CONCAT17(in_stack_fffffffffffffd6f,in_stack_fffffffffffffd68),__a);
      qstring_trait_t::from_ascii
                ((string *)CONCAT17(in_stack_fffffffffffffd6f,in_stack_fffffffffffffd68));
      tag_t<cfgfile::qstring_trait_t>::name(local_10);
      operator+((qstring_wrapper_t *)CONCAT17(in_stack_fffffffffffffd6f,in_stack_fffffffffffffd68),
                (qstring_wrapper_t *)__a);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_RDI,(char *)CONCAT17(in_stack_fffffffffffffd6f,in_stack_fffffffffffffd68),__a);
      qstring_trait_t::from_ascii
                ((string *)CONCAT17(in_stack_fffffffffffffd6f,in_stack_fffffffffffffd68));
      operator+((qstring_wrapper_t *)CONCAT17(in_stack_fffffffffffffd6f,in_stack_fffffffffffffd68),
                (qstring_wrapper_t *)__a);
      lexeme_t<cfgfile::qstring_trait_t>::value(&local_38);
      operator+((qstring_wrapper_t *)CONCAT17(in_stack_fffffffffffffd6f,in_stack_fffffffffffffd68),
                (qstring_wrapper_t *)__a);
      this_01 = local_1e9;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_RDI,(char *)CONCAT17(in_stack_fffffffffffffd6f,in_stack_fffffffffffffd68),__a);
      qstring_trait_t::from_ascii
                ((string *)CONCAT17(in_stack_fffffffffffffd6f,in_stack_fffffffffffffd68));
      operator+((qstring_wrapper_t *)CONCAT17(in_stack_fffffffffffffd6f,in_stack_fffffffffffffd68),
                (qstring_wrapper_t *)__a);
      this_00 = lexical_analyzer_t<cfgfile::qstring_trait_t>::input_stream
                          ((lexical_analyzer_t<cfgfile::qstring_trait_t> *)(in_RDI + 3));
      input_stream_t<cfgfile::qstring_trait_t>::file_name(this_00);
      operator+((qstring_wrapper_t *)CONCAT17(in_stack_fffffffffffffd6f,in_stack_fffffffffffffd68),
                (qstring_wrapper_t *)__a);
      what = local_229;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_RDI,(char *)CONCAT17(in_stack_fffffffffffffd6f,in_stack_fffffffffffffd68),__a);
      qstring_trait_t::from_ascii
                ((string *)CONCAT17(in_stack_fffffffffffffd6f,in_stack_fffffffffffffd68));
      operator+((qstring_wrapper_t *)CONCAT17(in_stack_fffffffffffffd6f,in_stack_fffffffffffffd68),
                (qstring_wrapper_t *)__a);
      lexical_analyzer_t<cfgfile::qstring_trait_t>::line_number
                ((lexical_analyzer_t<cfgfile::qstring_trait_t> *)(in_RDI + 3));
      qstring_trait_t::to_string(CONCAT17(in_stack_fffffffffffffd6f,in_stack_fffffffffffffd68));
      operator+((qstring_wrapper_t *)CONCAT17(in_stack_fffffffffffffd6f,in_stack_fffffffffffffd68),
                (qstring_wrapper_t *)__a);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_RDI,(char *)CONCAT17(in_stack_fffffffffffffd6f,in_stack_fffffffffffffd68),__a);
      qstring_trait_t::from_ascii
                ((string *)CONCAT17(in_stack_fffffffffffffd6f,in_stack_fffffffffffffd68));
      operator+((qstring_wrapper_t *)CONCAT17(in_stack_fffffffffffffd6f,in_stack_fffffffffffffd68),
                (qstring_wrapper_t *)__a);
      exception_t<cfgfile::qstring_trait_t>::exception_t(this_01,what);
      __cxa_throw(uVar3,&exception_t<cfgfile::qstring_trait_t>::typeinfo,
                  exception_t<cfgfile::qstring_trait_t>::~exception_t);
    }
    pptVar2 = __gnu_cxx::
              __normal_iterator<cfgfile::tag_t<cfgfile::qstring_trait_t>_*const_*,_std::vector<cfgfile::tag_t<cfgfile::qstring_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::qstring_trait_t>_*>_>_>
              ::operator*(&local_50);
    local_60 = *pptVar2;
    in_stack_fffffffffffffd6f =
         start_tag_parsing(in_stack_000001c8,in_stack_000001c0,in_stack_000001b8);
    if ((bool)in_stack_fffffffffffffd6f) {
      local_39 = 1;
      goto LAB_00137643;
    }
    __gnu_cxx::
    __normal_iterator<cfgfile::tag_t<cfgfile::qstring_trait_t>_*const_*,_std::vector<cfgfile::tag_t<cfgfile::qstring_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::qstring_trait_t>_*>_>_>
    ::operator++(&local_50);
  } while( true );
}

Assistant:

void start_tag_parsing( const tag_t< Trait > & parent,
		const typename tag_t< Trait >::child_tags_list_t & list )
	{
		lexeme_t< Trait > lexeme = m_lex.next_lexeme();

		bool tag_found = false;

		for( tag_t< Trait > * tag : list )
		{
			if( start_tag_parsing( lexeme, *tag ) )
			{
				tag_found = true;

				break;
			}
		}

		if( !tag_found )
			throw exception_t< Trait >(
				Trait::from_ascii( "Unexpected tag name. "
					"We expected one child tag of tag \"" ) +
				parent.name() +
				Trait::from_ascii( "\", but we've got \"" ) + lexeme.value() +
				Trait::from_ascii( "\". In file \"" ) +
				m_lex.input_stream().file_name() +
				Trait::from_ascii( "\" on line " ) +
				Trait::to_string( m_lex.line_number() ) +
				Trait::from_ascii( "." ) );
	}